

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ROIAlign_x86_fma::forward
          (ROIAlign_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  pointer pMVar5;
  Mat *this_00;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  _func_int **pp_Var10;
  _func_int *p_Var11;
  int iVar12;
  int iVar13;
  int iVar14;
  _func_int *p_Var15;
  long lVar16;
  float *pfVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar39 [12];
  undefined1 in_ZMM6 [64];
  undefined1 auVar38 [64];
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 in_register_000015c4 [12];
  allocator_type local_10d;
  int local_10c;
  void *local_108;
  void *local_100;
  void *local_f8;
  long local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  _func_int **local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ROIAlign_x86_fma *local_90;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  
  auVar39 = in_ZMM6._4_12_;
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar13 = pMVar5->w;
  iVar18 = pMVar5->h;
  local_e8 = (void *)(ulong)(uint)pMVar5->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_fma[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_fma[-3]),pMVar5->c,
              pMVar5->elemsize,opt->blob_allocator);
  iVar12 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var11 = this->_vptr_ROIAlign_x86_fma[-3];
    fVar29 = *(float *)(&this->field_0xd8 + (long)p_Var11);
    uVar2 = *pMVar5[1].data;
    uVar3 = *(undefined8 *)((long)pMVar5[1].data + 8);
    local_b8._0_4_ = fVar29 * (float)uVar2;
    local_b8._4_4_ = fVar29 * (float)((ulong)uVar2 >> 0x20);
    local_b8._8_4_ = fVar29 * 0.0;
    local_b8._12_4_ = fVar29 * 0.0;
    auVar26._0_4_ = (float)uVar3 * fVar29;
    auVar26._4_4_ = (float)((ulong)uVar3 >> 0x20) * fVar29;
    auVar26._8_4_ = fVar29 * 0.0;
    auVar26._12_4_ = fVar29 * 0.0;
    auVar26 = vsubps_avx(auVar26,local_b8);
    if ((&this->field_0xe0)[(long)p_Var11] == '\x01') {
      local_b8._0_4_ = (float)local_b8._0_4_ + -0.5;
      local_b8._4_4_ = local_b8._4_4_ + -0.5;
      local_b8._8_4_ = local_b8._8_4_ + -0.5;
      local_b8._12_4_ = local_b8._12_4_ + -0.5;
    }
    else {
      auVar27._8_4_ = 0x3f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar27._12_4_ = 0x3f800000;
      auVar26 = vmaxps_avx(auVar26,auVar27);
    }
    uVar4 = *(ulong *)(&this->field_0xd0 + (long)p_Var11);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar4;
    auVar27 = vcvtdq2ps_avx(auVar34);
    auVar34 = vrcpps_avx(auVar27);
    auVar33._0_4_ = auVar26._0_4_ * auVar34._0_4_;
    auVar33._4_4_ = auVar26._4_4_ * auVar34._4_4_;
    auVar33._8_4_ = auVar26._8_4_ * auVar34._8_4_;
    auVar33._12_4_ = auVar26._12_4_ * auVar34._12_4_;
    auVar26 = vfmsub213ps_fma(auVar27,auVar33,auVar26);
    local_c8 = vfnmadd213ps_fma(auVar26,auVar34,auVar33);
    iVar12 = (int)(uVar4 >> 0x20);
    local_90 = this;
    if (*(int *)(&this->field_0xe4 + (long)p_Var11) == 1) {
      local_a8 = vmovshdup_avx(local_c8);
      local_108 = (void *)CONCAT44(local_108._4_4_,iVar18);
      if (*(int *)(&this->field_0xdc + (long)p_Var11) < 1) {
        auVar26 = vroundss_avx(local_a8,local_a8,10);
        fVar29 = auVar26._0_4_;
        auVar26 = vroundss_avx(local_c8,local_c8,10);
        fVar36 = auVar26._0_4_;
      }
      else {
        fVar29 = (float)*(int *)(&this->field_0xdc + (long)p_Var11);
        fVar36 = fVar29;
      }
      iVar24 = (int)fVar29;
      iVar18 = (int)fVar36;
      local_f0 = (long)iVar24;
      local_10c = iVar13;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar12 * (long)(int)uVar4 * local_f0 * iVar18,&local_10d);
      auVar26 = vmovshdup_avx(local_b8);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)local_108,local_10c,
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_fma[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_fma[-3]),(int)local_f0,
                 iVar18,auVar26._0_4_,local_b8._0_4_,(float)local_a8._0_4_,(float)local_c8._0_4_,
                 (int)local_f0,iVar18,&pre_calc);
      if (0 < (int)local_e8) {
        iVar13 = 1;
        if (1 < iVar24 * iVar18) {
          iVar13 = iVar24 * iVar18;
        }
        local_d0 = (_func_int **)(pMVar5->cstep * pMVar5->elemsize);
        local_d8 = pMVar5->data;
        local_100 = (void *)(this_00->cstep * this_00->elemsize);
        local_e0 = this_00->data;
        pp_Var10 = this->_vptr_ROIAlign_x86_fma;
        iVar12 = 0;
        if (0 < iVar18) {
          iVar12 = iVar18;
        }
        local_10c = iVar12 * iVar24;
        local_a8._0_8_ = pp_Var10;
        p_Var11 = pp_Var10[-3];
        pvVar6 = (void *)0x0;
        do {
          local_f8 = pvVar6;
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var11)) {
            lVar23 = (long)local_d0 * (long)local_f8;
            local_108 = (void *)((long)local_100 * (long)local_f8 + (long)local_e0);
            iVar14 = 0;
            iVar25 = 0;
            do {
              local_f0 = CONCAT44(local_f0._4_4_,iVar14);
              lVar16 = (long)*(int *)(&this->field_0xd0 + (long)p_Var11);
              if (0 < lVar16) {
                lVar22 = 0;
                do {
                  if (iVar24 < 1) {
                    fVar29 = 0.0;
                  }
                  else {
                    fVar29 = 0.0;
                    iVar21 = 0;
                    iVar19 = iVar25;
                    do {
                      if (0 < iVar18) {
                        pfVar17 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar19].w1;
                        iVar20 = iVar18;
                        do {
                          auVar26 = vinsertps_avx(ZEXT416(*(uint *)((long)local_d8 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar17 + -4))->pos1 * 4 +
                                                                   lVar23)),
                                                  ZEXT416(*(uint *)((long)local_d8 +
                                                                   (long)(int)pfVar17[-3] * 4 +
                                                                   lVar23)),0x10);
                          auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)((long)local_d8 +
                                                                           (long)(int)pfVar17[-2] *
                                                                           4 + lVar23)),0x20);
                          auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)((long)local_d8 +
                                                                           (long)(int)pfVar17[-1] *
                                                                           4 + lVar23)),0x30);
                          auVar32._0_4_ = auVar26._0_4_ * *pfVar17;
                          auVar32._4_4_ = auVar26._4_4_ * pfVar17[1];
                          auVar32._8_4_ = auVar26._8_4_ * pfVar17[2];
                          auVar32._12_4_ = auVar26._12_4_ * pfVar17[3];
                          auVar26 = vhaddps_avx(auVar32,auVar32);
                          auVar26 = vhaddps_avx(auVar26,auVar26);
                          fVar29 = fVar29 + auVar26._0_4_;
                          pfVar17 = pfVar17 + 8;
                          iVar20 = iVar20 + -1;
                        } while (iVar20 != 0);
                      }
                      iVar21 = iVar21 + 1;
                      iVar19 = iVar19 + iVar12;
                    } while (iVar21 != iVar24);
                    iVar25 = iVar25 + local_10c;
                    this = local_90;
                  }
                  *(float *)((long)local_108 + lVar22 * 4) = fVar29 * (1.0 / (float)iVar13);
                  lVar22 = lVar22 + 1;
                  p_Var11 = pp_Var10[-3];
                  lVar16 = (long)*(int *)(&this->field_0xd0 + (long)p_Var11);
                } while (lVar22 < lVar16);
              }
              local_108 = (void *)((long)local_108 + lVar16 * 4);
              iVar14 = iVar14 + 1;
            } while (iVar14 < *(int *)(&this->field_0xd4 + (long)p_Var11));
          }
          pvVar6 = (void *)((long)local_f8 + 1);
        } while ((void *)((long)local_f8 + 1) != local_e8);
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var11) != 0) {
        return 0;
      }
      auVar30._0_4_ = (float)*(int *)(&this->field_0xdc + (long)p_Var11);
      auVar30._4_12_ = auVar39;
      auVar27 = vroundps_avx(local_c8,10);
      auVar26 = vpshufd_avx(ZEXT116(0 < *(int *)(&this->field_0xdc + (long)p_Var11)),0x50);
      auVar34 = vpslld_avx(auVar26,0x1f);
      auVar26 = vmovsldup_avx(auVar30);
      auVar26 = vblendvps_avx(auVar27,auVar26,auVar34);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)iVar12 * (long)(int)auVar26._4_4_ *
                 (long)(int)uVar4 * (long)(int)auVar26._0_4_,&local_10d);
      p_Var11 = this->_vptr_ROIAlign_x86_fma[-3];
      auVar26 = vmovshdup_avx(local_c8);
      auVar27 = vmovshdup_avx(local_b8);
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar18,iVar13,*(int *)(&this->field_0xd4 + (long)p_Var11),
                 *(int *)(&this->field_0xd0 + (long)p_Var11),auVar27._0_4_,(float)local_b8._0_4_,
                 auVar26._0_4_,local_c8._0_4_,*(int *)(&this->field_0xdc + (long)p_Var11),&pre_calc)
      ;
      if (0 < (int)local_e8) {
        local_e0 = (void *)(pMVar5->cstep * pMVar5->elemsize);
        pvVar6 = pMVar5->data;
        sVar7 = this_00->cstep;
        sVar8 = this_00->elemsize;
        pvVar9 = this_00->data;
        auVar28._0_4_ = (float)iVar18;
        auVar28._4_12_ = auVar39;
        local_d0 = this->_vptr_ROIAlign_x86_fma;
        auVar31._0_4_ = (float)iVar13;
        auVar31._4_12_ = auVar39;
        p_Var11 = local_d0[-3];
        local_100 = (void *)0x0;
        p_Var15 = p_Var11;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var15)) {
            lVar23 = (long)local_e0 * (long)local_100;
            local_f8 = (void *)(sVar7 * sVar8 * (long)local_100 + (long)pvVar9);
            iVar13 = 0;
            iVar18 = 0;
            do {
              lVar16 = (long)*(int *)(&this->field_0xd0 + (long)p_Var15);
              if (0 < lVar16) {
                auVar35._0_4_ = (float)iVar13;
                auVar35._4_12_ = in_register_000015c4;
                auVar34 = vfmadd213ss_fma(auVar35,auVar26,auVar27);
                local_d8 = (void *)CONCAT44(local_d8._4_4_,iVar13 + 1);
                auVar37._0_4_ = (float)(iVar13 + 1);
                auVar37._4_12_ = in_register_000015c4;
                auVar32 = vfmadd213ss_fma(auVar37,auVar26,auVar27);
                auVar34 = vmaxss_avx(auVar34,ZEXT816(0) << 0x40);
                auVar33 = vminss_avx(auVar28,auVar34);
                auVar34 = vmaxss_avx(auVar32,ZEXT816(0) << 0x40);
                auVar34 = vminss_avx(auVar28,auVar34);
                fVar29 = auVar33._0_4_;
                fVar36 = auVar34._0_4_;
                auVar34 = vroundss_avx(ZEXT416((uint)(fVar36 - fVar29)),
                                       ZEXT416((uint)(fVar36 - fVar29)),10);
                p_Var11 = p_Var15;
                lVar22 = 0;
                do {
                  auVar42._0_4_ = (float)(int)lVar22;
                  auVar42._4_12_ = in_register_000015c4;
                  auVar33 = vfmadd213ss_fma(auVar42,local_c8,local_b8);
                  lVar1 = lVar22 + 1;
                  auVar45._0_4_ = (float)(int)lVar1;
                  auVar45._4_12_ = in_register_000015c4;
                  auVar30 = vfmadd213ss_fma(auVar45,local_c8,local_b8);
                  auVar35 = ZEXT816(0) << 0x40;
                  auVar38 = ZEXT1664(auVar35);
                  auVar33 = vmaxss_avx(auVar33,auVar35);
                  auVar32 = vminss_avx(auVar31,auVar33);
                  auVar33 = vmaxss_avx(auVar30,auVar35);
                  auVar33 = vminss_avx(auVar33,auVar31);
                  fVar40 = auVar32._0_4_;
                  fVar44 = auVar33._0_4_;
                  if (*(int *)(&this->field_0xdc + (long)p_Var11) < 1) {
                    auVar33 = vroundss_avx(ZEXT416((uint)(fVar44 - fVar40)),
                                           ZEXT416((uint)(fVar44 - fVar40)),10);
                    fVar46 = auVar34._0_4_;
                    fVar41 = auVar33._0_4_;
                  }
                  else {
                    fVar46 = (float)*(int *)(&this->field_0xdc + (long)p_Var11);
                    fVar41 = fVar46;
                  }
                  iVar12 = (int)fVar46;
                  iVar24 = (int)fVar41;
                  if (0 < iVar12) {
                    local_f0 = CONCAT71(local_f0._1_7_,fVar44 <= fVar40);
                    local_10c = CONCAT31(local_10c._1_3_,fVar36 <= fVar29);
                    local_a8._0_8_ = lVar1;
                    iVar25 = 0;
                    iVar14 = 0;
                    if (0 < iVar24) {
                      iVar14 = iVar24;
                    }
                    local_108 = (void *)CONCAT44(local_108._4_4_,iVar18);
                    iVar19 = iVar18;
                    do {
                      if (0 < iVar24) {
                        pfVar17 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar19].w1;
                        iVar21 = iVar24;
                        do {
                          auVar33 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar6 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar17 + -4))->pos1 * 4 +
                                                                   lVar23)),
                                                  ZEXT416(*(uint *)((long)pvVar6 +
                                                                   (long)(int)pfVar17[-3] * 4 +
                                                                   lVar23)),0x10);
                          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)((long)pvVar6 +
                                                                           (long)(int)pfVar17[-2] *
                                                                           4 + lVar23)),0x20);
                          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)((long)pvVar6 +
                                                                           (long)(int)pfVar17[-1] *
                                                                           4 + lVar23)),0x30);
                          auVar43._0_4_ = auVar33._0_4_ * *pfVar17;
                          auVar43._4_4_ = auVar33._4_4_ * pfVar17[1];
                          auVar43._8_4_ = auVar33._8_4_ * pfVar17[2];
                          auVar43._12_4_ = auVar33._12_4_ * pfVar17[3];
                          auVar33 = vhaddps_avx(auVar43,auVar43);
                          auVar33 = vhaddps_avx(auVar33,auVar33);
                          auVar38 = ZEXT464((uint)(auVar38._0_4_ + auVar33._0_4_));
                          pfVar17 = pfVar17 + 8;
                          iVar21 = iVar21 + -1;
                        } while (iVar21 != 0);
                      }
                      auVar35 = auVar38._0_16_;
                      iVar25 = iVar25 + 1;
                      iVar19 = iVar19 + iVar14;
                    } while (iVar25 != iVar12);
                    iVar18 = iVar18 + iVar14 * iVar12;
                    this = local_90;
                  }
                  fVar41 = 0.0;
                  if (fVar36 > fVar29 && fVar44 > fVar40) {
                    fVar41 = auVar35._0_4_ / (float)(iVar24 * iVar12);
                  }
                  *(float *)((long)local_f8 + lVar22 * 4) = fVar41;
                  p_Var11 = local_d0[-3];
                  lVar16 = (long)*(int *)(&this->field_0xd0 + (long)p_Var11);
                  lVar22 = lVar1;
                } while (lVar1 < lVar16);
              }
              iVar13 = iVar13 + 1;
              local_f8 = (void *)((long)local_f8 + lVar16 * 4);
              p_Var15 = p_Var11;
            } while (iVar13 < *(int *)(&this->field_0xd4 + (long)p_Var11));
          }
          local_100 = (void *)((long)local_100 + 1);
        } while (local_100 != local_e8);
      }
    }
    if (pre_calc.super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pre_calc.
                      super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int ROIAlign_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}